

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::cancelUntil(Solver *this,int bLevel,bool allow_trail_saving)

{
  double dVar1;
  int iVar2;
  decision_heuristic dVar3;
  int *piVar4;
  VarData *pVVar5;
  double *pdVar6;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  Lit *pLVar7;
  Lit *pLVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  double dVar15;
  
  if (bLevel < (this->trail_lim).sz) {
    reset_old_trail(this);
    if ((allow_trail_saving) && (this->use_backuped_trail == true)) {
      bVar9 = 1 < (this->trail_lim).sz - bLevel;
    }
    else {
      bVar9 = false;
    }
    if ((this->add_tmp).data != (Lit *)0x0) {
      (this->add_tmp).sz = 0;
    }
    lVar11 = (long)(this->trail).sz;
    while( true ) {
      piVar4 = (this->trail_lim).data;
      iVar14 = piVar4[bLevel];
      if (lVar11 <= iVar14) break;
      lVar13 = lVar11 + -1;
      pVVar5 = (this->vardata).data;
      pLVar7 = (this->trail).data + lVar13;
      iVar14 = pLVar7->x >> 1;
      if (bLevel < pVVar5[iVar14].level) {
        if (bVar9) {
          iVar2 = (this->old_trail).sz;
          (this->old_trail).sz = iVar2 + 1;
          (this->old_trail).data[iVar2].x = pLVar7->x;
          (this->oldreasons).data[iVar14] = pVVar5[iVar14].reason;
        }
        dVar3 = this->current_heuristic;
        if ((VSIDS_DISTANCE < dVar3) &&
           (uVar12 = (int)this->conflicts - (this->picked).data[iVar14], uVar12 != 0)) {
          pdVar6 = (this->activity_CHB).data;
          dVar1 = pdVar6[iVar14];
          dVar15 = ((double)((this->almost_conflicted).data[iVar14] +
                            (this->conflicted).data[iVar14]) / (double)uVar12) * this->step_size +
                   (1.0 - this->step_size) * dVar1;
          pdVar6[iVar14] = dVar15;
          if ((dVar3 == CHB) &&
             ((this_00 = this->order_heap, iVar14 < (this_00->indices).sz &&
              (-1 < (this_00->indices).data[iVar14])))) {
            if (dVar15 <= dVar1) {
              Heap<Minisat::Solver::VarOrderLt>::increase(this_00,iVar14);
            }
            else {
              Heap<Minisat::Solver::VarOrderLt>::decrease(this_00,iVar14);
            }
          }
        }
        (this->canceled).data[iVar14] = (uint)this->conflicts;
        (this->assigns).data[iVar14].value = '\x02';
        if ((1 < this->phase_saving) ||
           ((this->phase_saving == 1 &&
            ((this->trail_lim).data[(long)(this->trail_lim).sz + -1] < lVar13)))) {
          (this->polarity).data[iVar14] = (byte)(this->trail).data[lVar11 + -1].x & 1;
        }
        insertVarOrder(this,iVar14);
        lVar11 = lVar13;
      }
      else {
        vec<Minisat::Lit>::push(&this->add_tmp,pLVar7);
        lVar11 = lVar13;
      }
    }
    this->qhead = iVar14;
    vec<Minisat::Lit>::shrink(&this->trail,(this->trail).sz - piVar4[bLevel]);
    vec<int>::shrink(&this->trail_lim,(this->trail_lim).sz - bLevel);
    pLVar7 = (this->add_tmp).data;
    pLVar8 = (this->trail).data;
    for (uVar10 = (ulong)(uint)(this->add_tmp).sz; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
      iVar14 = (this->trail).sz;
      (this->trail).sz = iVar14 + 1;
      pLVar8[iVar14].x = pLVar7[uVar10 - 1].x;
    }
    if (pLVar7 != (Lit *)0x0) {
      (this->add_tmp).sz = 0;
    }
    if (bVar9) {
      lVar11 = (long)(this->old_trail).sz;
      pLVar7 = (this->old_trail).data;
      for (lVar13 = 0; lVar11 = lVar11 + -1, lVar13 < lVar11; lVar13 = lVar13 + 1) {
        iVar14 = pLVar7[lVar13].x;
        pLVar7[lVar13].x = pLVar7[lVar11].x;
        pLVar7[lVar11].x = iVar14;
      }
      this->backuped_trail_lits = this->backuped_trail_lits + (long)(this->old_trail).sz;
    }
  }
  return;
}

Assistant:

void Solver::cancelUntil(int bLevel, bool allow_trail_saving)
{

    if (decisionLevel() > bLevel) {
        TRACE(std::cout << "c backtrack to " << bLevel << std::endl);

        reset_old_trail();

        bool savetrail = allow_trail_saving && use_backuped_trail && (decisionLevel() - bLevel > 1);

        add_tmp.clear();
        for (int c = trail.size() - 1; c >= trail_lim[bLevel]; c--) {
            Var x = var(trail[c]);

            if (level(x) <= bLevel) {
                add_tmp.push(trail[c]);
                continue;
            }
            if (savetrail) {
                old_trail.push_(trail[c]); /* we traverse trail in reverse order */
                oldreasons[x] = reason(x);
            }

            if (!usesVSIDS()) {
                uint32_t age = conflicts - picked[x];
                if (age > 0) {
                    double adjusted_reward = ((double)(conflicted[x] + almost_conflicted[x])) / ((double)age);
                    double old_activity = activity_CHB[x];
                    activity_CHB[x] = step_size * adjusted_reward + ((1 - step_size) * old_activity);
                    if (usesCHB() && order_heap->inHeap(x)) {
                        if (activity_CHB[x] > old_activity)
                            order_heap->decrease(x);
                        else
                            order_heap->increase(x);
                    }
                }
            }
#ifdef ANTI_EXPLORATION
            canceled[x] = conflicts;
#endif

            assigns[x] = l_Undef;
#ifdef PRINT_OUT
            std::cout << "undo " << x << "\n";
#endif
            if (phase_saving > 1 || ((phase_saving == 1) && c > trail_lim.last())) polarity[x] = sign(trail[c]);
            insertVarOrder(x);
        }
        qhead = trail_lim[bLevel];
        trail.shrink(trail.size() - trail_lim[bLevel]);
        trail_lim.shrink(trail_lim.size() - bLevel);
        for (int nLitId = add_tmp.size() - 1; nLitId >= 0; --nLitId) {
            trail.push_(add_tmp[nLitId]);
        }

        add_tmp.clear();

        /* reverse saved trail, as we added elements in reverse order as well */
        if (savetrail) {
            int i = 0, j = old_trail.size() - 1;
            while (i < j) {
                const Lit l = old_trail[i];
                old_trail[i++] = old_trail[j];
                old_trail[j--] = l;
            }
            backuped_trail_lits += old_trail.size();
        }
    }
}